

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_Object * __thiscall ON_AngularDimension2Extra::Internal_DeepCopy(ON_AngularDimension2Extra *this)

{
  ON_AngularDimension2Extra *this_00;
  ON_AngularDimension2Extra *this_local;
  
  this_00 = (ON_AngularDimension2Extra *)operator_new(0xd8);
  ON_AngularDimension2Extra(this_00,this);
  return (ON_Object *)this_00;
}

Assistant:

ON_AngularDimension2Extra* ON_AngularDimension2Extra::AngularDimensionExtra(ON_OBSOLETE_V5_DimAngular* pDim)
{
  ON_AngularDimension2Extra* pExtra = 0;
  if(pDim)
  {
    pExtra = ON_AngularDimension2Extra::Cast(pDim->GetUserData(ON_CLASS_ID(ON_AngularDimension2Extra)));
    if(pExtra == 0)
    {
      pExtra = new ON_AngularDimension2Extra;
      if( pExtra)
      {
        if(!pDim->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}